

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void traverseweakvalue(global_State *g,Table *h)

{
  byte bVar1;
  Node *pNVar2;
  int iVar3;
  bool bVar4;
  int hasclears;
  Node *limit;
  Node *n;
  Table *h_local;
  global_State *g_local;
  
  pNVar2 = h->node;
  bVar1 = h->lsizenode;
  bVar4 = h->sizearray != 0;
  for (limit = h->node; limit < pNVar2 + (1 << (bVar1 & 0x1f)); limit = limit + 1) {
    if ((limit->i_val).tt_ == 0) {
      removeentry(limit);
    }
    else {
      if ((((limit->i_key).nk.tt_ & 0x40U) != 0) &&
         ((((limit->i_key).nk.value_.gc)->marked & 3) != 0)) {
        reallymarkobject(g,(limit->i_key).nk.value_.gc);
      }
      if ((!bVar4) && (iVar3 = iscleared(g,&limit->i_val), iVar3 != 0)) {
        bVar4 = true;
      }
    }
  }
  if (g->gcstate == '\0') {
    h->gclist = g->grayagain;
    g->grayagain = (GCObject *)h;
  }
  else if (bVar4) {
    h->gclist = g->weak;
    g->weak = (GCObject *)h;
  }
  return;
}

Assistant:

static void traverseweakvalue (global_State *g, Table *h) {
  Node *n, *limit = gnodelast(h);
  /* if there is array part, assume it may have white values (it is not
     worth traversing it now just to check) */
  int hasclears = (h->sizearray > 0);
  for (n = gnode(h, 0); n < limit; n++) {  /* traverse hash part */
    checkdeadkey(n);
    if (ttisnil(gval(n)))  /* entry is empty? */
      removeentry(n);  /* remove it */
    else {
      lua_assert(!ttisnil(gkey(n)));
      markvalue(g, gkey(n));  /* mark key */
      if (!hasclears && iscleared(g, gval(n)))  /* is there a white value? */
        hasclears = 1;  /* table will have to be cleared */
    }
  }
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasclears)
    linkgclist(h, g->weak);  /* has to be cleared later */
}